

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O0

pair<eastl::pair<int,_int>_*,_bool> __thiscall
eastl::vector_map<int,_int,_eastl::less<int>,_eastl::allocator>::insert
          (vector_map<int,_int,_eastl::less<int>,_eastl::allocator> *this,value_type *val)

{
  bool bVar1;
  iterator position;
  iterator ppVar2;
  iterator a;
  pair<eastl::pair<int,_int>_*,_bool> pVar3;
  iterator i;
  value_type *val_local;
  vector_map<int,_int,_eastl::less<int>,_eastl::allocator> *this_local;
  undefined1 local_10;
  
  position = lower_bound(this,&val->first);
  ppVar2 = end(this);
  if (position != ppVar2) {
    bVar1 = detail::compare_impl<eastl::pair<int,_int>,_eastl::less<int>_>::operator()
                      ((compare_impl<eastl::pair<int,_int>,_eastl::less<int>_> *)&this->field_0x20,
                       &val->first,&position->first);
    if (!bVar1) {
      pVar3 = make_pair<eastl::pair<int,int>*,bool>(position,false);
      local_10 = pVar3.second;
      goto LAB_0010f042;
    }
  }
  a = vector<eastl::pair<int,_int>,_eastl::allocator>::insert(&this->m_base,position,val);
  pVar3 = make_pair<eastl::pair<int,int>*,bool>(a,true);
  local_10 = pVar3.second;
LAB_0010f042:
  this_local = (vector_map<int,_int,_eastl::less<int>,_eastl::allocator> *)pVar3.first;
  pVar3.second = (bool)local_10;
  pVar3.first = (pair<int,_int> *)this_local;
  return pVar3;
}

Assistant:

::eastl::pair<iterator, bool> insert(value_type const& val) {
    iterator const i(lower_bound(val.first));

    return (i == end() || m_cmp(val.first, i->first))
        ? ::eastl::make_pair(m_base.insert(i, val), true)
        : ::eastl::make_pair(i, false)
        ;
  }